

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CheckpointBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  vector<duckdb::Value,_true> *this_00;
  DatabaseManager *this_01;
  reference pvVar1;
  string *psVar2;
  BinderException *pBVar3;
  allocator local_71;
  optional_ptr<duckdb::AttachedDatabase,_true> local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BOOLEAN);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [8])"Success");
  this_01 = DatabaseManager::Get(context);
  this_00 = input->inputs;
  if ((this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar2 = DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
    local_70 = DatabaseManager::GetDatabase(this_01,context,psVar2);
  }
  else {
    pvVar1 = vector<duckdb::Value,_true>::get<true>(this_00,0);
    if (pvVar1->is_null == true) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_68,"Database cannot be NULL",&local_71);
      BinderException::BinderException(pBVar3,&local_68);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar1 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
    psVar2 = StringValue::Get_abi_cxx11_(pvVar1);
    local_70 = DatabaseManager::GetDatabase(this_01,context,psVar2);
    if (local_70.ptr == (AttachedDatabase *)0x0) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_68,"Database \"%s\" not found",&local_71);
      ::std::__cxx11::string::string((string *)&local_48,(string *)psVar2);
      BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_68,&local_48);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  make_uniq<duckdb::CheckpointBindData,duckdb::optional_ptr<duckdb::AttachedDatabase,true>&>
            ((duckdb *)&local_68,&local_70);
  *(pointer *)this = local_68._M_dataplus._M_p;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> CheckpointBind(ClientContext &context, TableFunctionBindInput &input,
                                               vector<LogicalType> &return_types, vector<string> &names) {
	return_types.emplace_back(LogicalType::BOOLEAN);
	names.emplace_back("Success");

	optional_ptr<AttachedDatabase> db;
	auto &db_manager = DatabaseManager::Get(context);
	if (!input.inputs.empty()) {
		if (input.inputs[0].IsNull()) {
			throw BinderException("Database cannot be NULL");
		}
		auto &db_name = StringValue::Get(input.inputs[0]);
		db = db_manager.GetDatabase(context, db_name);
		if (!db) {
			throw BinderException("Database \"%s\" not found", db_name);
		}
	} else {
		db = db_manager.GetDatabase(context, DatabaseManager::GetDefaultDatabase(context));
	}
	return make_uniq<CheckpointBindData>(db);
}